

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O2

void __thiscall irr::scene::CSceneManager::~CSceneManager(CSceneManager *this,void **vtt)

{
  _func_int **pp_Var1;
  ICursorControl *pIVar2;
  ISceneCollisionManager *pIVar3;
  pointer ppIVar4;
  IMeshLoader *pIVar5;
  ICameraSceneNode *pIVar6;
  IMeshCache *pIVar7;
  CAttributes *pCVar8;
  IVideoDriver *pIVar9;
  ulong uVar10;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ISceneManager)._vptr_ISceneManager = pp_Var1;
  *(void **)((long)&(this->super_ISceneManager)._vptr_ISceneManager + (long)pp_Var1[-3]) = vtt[5];
  *(void **)&(this->super_ISceneManager).field_0x8 = vtt[6];
  clearDeletionList(this);
  if (this->Driver != (IVideoDriver *)0x0) {
    (*this->Driver->_vptr_IVideoDriver[0x19])();
  }
  pIVar2 = this->CursorControl;
  if (pIVar2 != (ICursorControl *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar2->_vptr_ICursorControl + (long)pIVar2->_vptr_ICursorControl[-3]));
  }
  pIVar3 = this->CollisionManager;
  if (pIVar3 != (ISceneCollisionManager *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar3->_vptr_ISceneCollisionManager +
               (long)pIVar3->_vptr_ISceneCollisionManager[-3]));
  }
  for (uVar10 = 0;
      ppIVar4 = (this->MeshLoaderList).m_data.
                super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar10 < ((ulong)((long)(this->MeshLoaderList).m_data.
                              super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar4) >> 3 &
               0xffffffff); uVar10 = uVar10 + 1) {
    pIVar5 = ppIVar4[uVar10];
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar5->_vptr_IMeshLoader +
               (long)pIVar5->_vptr_IMeshLoader[0xfffffffffffffffd]));
  }
  pIVar6 = this->ActiveCamera;
  if (pIVar6 != (ICameraSceneNode *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)(pIVar6->super_ISceneNode).AbsoluteTransformation.M +
               (long)((pIVar6->super_ISceneNode)._vptr_ISceneNode[-3] + -0x30)));
  }
  this->ActiveCamera = (ICameraSceneNode *)0x0;
  pIVar7 = this->MeshCache;
  if (pIVar7 != (IMeshCache *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar7->_vptr_IMeshCache + (long)pIVar7->_vptr_IMeshCache[-3]));
  }
  pCVar8 = this->Parameters;
  if (pCVar8 != (CAttributes *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&(pCVar8->super_IAttributes)._vptr_IAttributes +
               (long)(pCVar8->super_IAttributes)._vptr_IAttributes[-3]));
  }
  (*(this->super_ISceneManager)._vptr_ISceneManager[0x28])(this);
  pIVar9 = this->Driver;
  if (pIVar9 != (IVideoDriver *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar9->_vptr_IVideoDriver + (long)pIVar9->_vptr_IVideoDriver[-3]));
  }
  ::std::_Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>::
  ~_Vector_base((_Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *
                )&this->DeletionList);
  ::std::_Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>::
  ~_Vector_base((_Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
                 *)&this->MeshLoaderList);
  ::std::_Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>::
  ~_Vector_base((_Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *
                )&this->GuiNodeList);
  ::std::
  _Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
  ::~_Vector_base((_Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
                   *)&this->TransparentEffectNodeList);
  ::std::
  _Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
  ::~_Vector_base((_Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
                   *)&this->TransparentNodeList);
  ::std::
  _Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
  ::~_Vector_base((_Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
                   *)&this->SolidNodeList);
  ::std::_Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>::
  ~_Vector_base((_Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *
                )&this->SkyBoxList);
  ::std::_Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>::
  ~_Vector_base((_Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *
                )&this->CameraList);
  ISceneNode::~ISceneNode((ISceneNode *)&(this->super_ISceneManager).field_0x8,vtt + 3);
  return;
}

Assistant:

CSceneManager::~CSceneManager()
{
	clearDeletionList();

	//! force to remove hardwareTextures from the driver
	//! because Scenes may hold internally data bounded to sceneNodes
	//! which may be destroyed twice
	if (Driver)
		Driver->removeAllHardwareBuffers();

	if (CursorControl)
		CursorControl->drop();

	if (CollisionManager)
		CollisionManager->drop();

	u32 i;
	for (i = 0; i < MeshLoaderList.size(); ++i)
		MeshLoaderList[i]->drop();

	if (ActiveCamera)
		ActiveCamera->drop();
	ActiveCamera = 0;

	if (MeshCache)
		MeshCache->drop();

	if (Parameters)
		Parameters->drop();

	// remove all nodes before dropping the driver
	// as render targets may be destroyed twice

	removeAll();

	if (Driver)
		Driver->drop();
}